

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void insert_region(int start,int last,REGION_TYPES type,REGIONS *regions,int *num_regions,
                  int *cur_region_idx)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  long in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  int in_EDI;
  int *in_R8;
  int *in_R9;
  int r;
  int num_add;
  int this_region_last;
  REGION_TYPES this_region_type;
  int k;
  undefined4 local_3c;
  undefined4 local_2c;
  
  local_2c = *in_R9;
  uVar1 = *(undefined4 *)(in_RCX + (long)local_2c * 0x38 + 0x30);
  iVar2 = *(int *)(in_RCX + (long)local_2c * 0x38 + 4);
  iVar3 = (uint)(in_EDI != *(int *)(in_RCX + (long)local_2c * 0x38)) +
          (uint)(in_ESI != *(int *)(in_RCX + (long)local_2c * 0x38 + 4));
  local_3c = *in_R8;
  while (local_3c = local_3c + -1, local_2c < local_3c) {
    memcpy((void *)(in_RCX + (long)(local_3c + iVar3) * 0x38),
           (void *)(in_RCX + (long)local_3c * 0x38),0x38);
  }
  *in_R8 = iVar3 + *in_R8;
  if (*(int *)(in_RCX + (long)local_2c * 0x38) < in_EDI) {
    *(int *)(in_RCX + (long)local_2c * 0x38 + 4) = in_EDI + -1;
    local_2c = local_2c + 1;
    *(int *)(in_RCX + (long)local_2c * 0x38) = in_EDI;
  }
  *(undefined4 *)(in_RCX + (long)local_2c * 0x38 + 0x30) = in_EDX;
  if (in_ESI < iVar2) {
    *(int *)(in_RCX + (long)local_2c * 0x38 + 4) = in_ESI;
    local_2c = local_2c + 1;
    *(int *)(in_RCX + (long)local_2c * 0x38) = in_ESI + 1;
    *(int *)(in_RCX + (long)local_2c * 0x38 + 4) = iVar2;
    *(undefined4 *)(in_RCX + (long)local_2c * 0x38 + 0x30) = uVar1;
  }
  else {
    *(int *)(in_RCX + (long)local_2c * 0x38 + 4) = iVar2;
  }
  *in_R9 = local_2c;
  return;
}

Assistant:

static void insert_region(int start, int last, REGION_TYPES type,
                          REGIONS *regions, int *num_regions,
                          int *cur_region_idx) {
  int k = *cur_region_idx;
  REGION_TYPES this_region_type = regions[k].type;
  int this_region_last = regions[k].last;
  int num_add = (start != regions[k].start) + (last != regions[k].last);
  // move the following regions further to the back
  for (int r = *num_regions - 1; r > k; r--) {
    regions[r + num_add] = regions[r];
  }
  *num_regions += num_add;
  if (start > regions[k].start) {
    regions[k].last = start - 1;
    k++;
    regions[k].start = start;
  }
  regions[k].type = type;
  if (last < this_region_last) {
    regions[k].last = last;
    k++;
    regions[k].start = last + 1;
    regions[k].last = this_region_last;
    regions[k].type = this_region_type;
  } else {
    regions[k].last = this_region_last;
  }
  *cur_region_idx = k;
}